

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IO.cpp
# Opt level: O3

void __thiscall adios2::core::IO::ExitComputationBlock(IO *this)

{
  Mode MVar1;
  _Rb_tree_node_base *p_Var2;
  
  for (p_Var2 = (this->m_Engines)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var2 != &(this->m_Engines)._M_t._M_impl.super__Rb_tree_header;
      p_Var2 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var2)) {
    MVar1 = Engine::OpenMode(*(Engine **)(p_Var2 + 2));
    if (MVar1 != Read) {
      (**(code **)(**(long **)(p_Var2 + 2) + 0xa0))();
    }
  }
  return;
}

Assistant:

void IO::ExitComputationBlock() noexcept
{
    for (auto &enginePair : m_Engines)
    {
        auto &engine = enginePair.second;
        if (engine->OpenMode() != Mode::Read)
        {
            enginePair.second->ExitComputationBlock();
        }
    }
}